

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

string * __thiscall
libtorrent::aux::torrent::resolve_filename_abi_cxx11_
          (string *__return_storage_ptr__,torrent *this,file_index_t file)

{
  bool bVar1;
  element_type *this_00;
  file_storage *this_01;
  bool local_91;
  file_storage *st;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  torrent *local_20;
  torrent *this_local;
  string *psStack_10;
  file_index_t file_local;
  
  local_20 = this;
  this_local._4_4_ = file.m_val;
  psStack_10 = __return_storage_ptr__;
  bVar1 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator==
                    ((strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                     ((long)&this_local + 4),&torrent_status::error_file_none);
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_21);
    ::std::allocator<char>::~allocator(&local_21);
  }
  else {
    bVar1 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator==
                      ((strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                       ((long)&this_local + 4),&torrent_status::error_file_ssl_ctx);
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"SSL Context",local_35);
      ::std::allocator<char>::~allocator(local_35);
    }
    else {
      bVar1 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator==
                        ((strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                         ((long)&this_local + 4),&torrent_status::error_file_exception);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"exception",&local_36);
        ::std::allocator<char>::~allocator(&local_36);
      }
      else {
        bVar1 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator==
                          ((strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                           ((long)&this_local + 4),&torrent_status::error_file_partfile);
        if (bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"partfile",&local_37);
          ::std::allocator<char>::~allocator(&local_37);
        }
        else {
          bVar1 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator==
                            ((strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                             ((long)&this_local + 4),&torrent_status::error_file_metadata);
          if (bVar1) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,"metadata",&local_38);
            ::std::allocator<char>::~allocator(&local_38);
          }
          else {
            bVar1 = storage_holder::operator_cast_to_bool(&this->m_storage);
            local_91 = false;
            if (bVar1) {
              strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::strong_typedef
                        ((strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                         ((long)&st + 4),0);
              local_91 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator>=
                                   ((strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                                    ((long)&this_local + 4),
                                    (strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                                    ((long)&st + 4));
            }
            if (local_91 == false) {
              ::std::__cxx11::string::string
                        ((string *)__return_storage_ptr__,(string *)&this->m_save_path);
            }
            else {
              this_00 = ::std::
                        __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)&(this->super_torrent_hot_members).m_torrent_file);
              this_01 = torrent_info::files(this_00);
              file_storage::file_path
                        (__return_storage_ptr__,this_01,this_local._4_4_,&this->m_save_path);
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string torrent::resolve_filename(file_index_t const file) const
	{
		if (file == torrent_status::error_file_none) return "";
		if (file == torrent_status::error_file_ssl_ctx) return "SSL Context";
		if (file == torrent_status::error_file_exception) return "exception";
		if (file == torrent_status::error_file_partfile) return "partfile";
		if (file == torrent_status::error_file_metadata) return "metadata";

		if (m_storage && file >= file_index_t(0))
		{
			file_storage const& st = m_torrent_file->files();
			return st.file_path(file, m_save_path);
		}
		else
		{
			return m_save_path;
		}
	}